

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O0

void check_eq_file(string *src_name)

{
  char *__filename;
  decoder d;
  encoder e;
  string dst_name;
  string *in_stack_fffffffffffff728;
  encoder *in_stack_fffffffffffff730;
  allocator<char> *this;
  allocator<char> local_8b1;
  char *in_stack_fffffffffffff750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff758;
  allocator<char> *in_stack_fffffffffffff760;
  char *in_stack_fffffffffffff768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff770;
  allocator<char> local_461;
  string local_460 [312];
  string *in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffce0;
  string local_28 [40];
  
  std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760);
  encoder::encoder(in_stack_fffffffffffff730,in_stack_fffffffffffff728,(string *)0x14da4f);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  encoder::encode((encoder *)in_stack_fffffffffffff770);
  encoder::~encoder((encoder *)0x14da87);
  this = &local_8b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760);
  decoder::decoder((decoder *)this,in_stack_fffffffffffff728,(string *)0x14dac5);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff750);
  std::allocator<char>::~allocator(&local_8b1);
  decoder::decode((decoder *)this);
  decoder::~decoder((decoder *)0x14daf1);
  remove("encoded");
  cmp_files(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void check_eq_file(const std::string& src_name) {
    std::string dst_name = src_name + "_";
    {
        encoder e(src_name, "encoded");
        e.encode();
    }
    {
        decoder d("encoded", dst_name);
        d.decode();
    }

    std::remove("encoded");

    cmp_files(src_name, dst_name);
    std::remove(dst_name.c_str());
}